

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseBareFunctionType(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  
  iVar10 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar10 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar10 < 0x100) {
    pPVar1 = &state->parse_state;
    iVar3 = (state->parse_state).prev_name_idx;
    iVar6 = (state->parse_state).mangled_idx;
    iVar7 = (state->parse_state).out_cur_idx;
    uVar4 = *(uint *)&(state->parse_state).field_0xc;
    *(uint *)&(state->parse_state).field_0xc = uVar4 & 0x7fffffff;
    iVar11 = iVar10 + 2;
    state->recursion_depth = iVar11;
    state->steps = iVar2 + 2;
    if (iVar2 < 0x1ffff && iVar10 < 0xff) {
      while( true ) {
        iVar10 = pPVar1->mangled_idx;
        iVar2 = pPVar1->out_cur_idx;
        iVar11 = (state->parse_state).prev_name_idx;
        uVar5 = *(undefined4 *)&(state->parse_state).field_0xc;
        bVar8 = ParseTwoCharToken(state,"Ua");
        if ((!bVar8) || (bVar8 = ParseName(state), !bVar8)) break;
        iVar11 = state->recursion_depth;
        iVar10 = state->steps;
        state->steps = iVar10 + 1;
        if ((0x100 < iVar11) || (0x1ffff < iVar10)) goto LAB_00190214;
      }
      pPVar1->mangled_idx = iVar10;
      pPVar1->out_cur_idx = iVar2;
      (state->parse_state).prev_name_idx = iVar11;
      *(undefined4 *)&(state->parse_state).field_0xc = uVar5;
      iVar11 = state->recursion_depth;
    }
LAB_00190214:
    state->recursion_depth = iVar11 + -1;
    bVar8 = ParseType(state);
    if (bVar8) {
      do {
        bVar9 = ParseType(state);
      } while (bVar9);
      *(uint *)&(state->parse_state).field_0xc =
           *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar4 & 0x80000000;
      MaybeAppend(state,"()");
    }
    else {
      (state->parse_state).prev_name_idx = iVar3;
      pPVar1->mangled_idx = iVar6;
      pPVar1->out_cur_idx = iVar7;
      *(uint *)&(state->parse_state).field_0xc = uVar4;
    }
    iVar10 = state->recursion_depth + -1;
  }
  else {
    bVar8 = false;
  }
  state->recursion_depth = iVar10;
  return bVar8;
}

Assistant:

static bool ParseBareFunctionType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  DisableAppend(state);
  if (ZeroOrMore(ParseOverloadAttribute, state) &&
      OneOrMore(ParseType, state)) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "()");
    return true;
  }
  state->parse_state = copy;
  return false;
}